

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

DatabaseSnapshot * __thiscall
Database::snapshot(DatabaseSnapshot *__return_storage_ptr__,Database *this)

{
  pointer ppOVar1;
  pointer ppOVar2;
  __node_base *p_Var3;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> cds;
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  taskspecs;
  __alloc_node_gen_t __alloc_node_gen;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_198;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_180;
  undefined1 local_168 [16];
  undefined1 local_158 [56];
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_TaskSpec>,_false>_>_>
  local_120;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  local_118;
  path local_e8;
  path local_a8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_198.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (OnDiskDataset **)0x0;
  local_198.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (OnDiskDataset **)0x0;
  ppOVar2 = (this->working_datasets).
            super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar1 = (this->working_datasets).
            super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar2 != ppOVar1) {
    do {
      local_158._0_8_ = *ppOVar2;
      if (local_198.
          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_198.
          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
        _M_realloc_insert<OnDiskDataset_const*const&>
                  ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)&local_198,
                   (iterator)
                   local_198.
                   super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(OnDiskDataset **)local_158);
      }
      else {
        *local_198.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = (OnDiskDataset *)local_158._0_8_;
        local_198.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_198.
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ppOVar2 = ppOVar2 + 1;
    } while (ppOVar2 != ppOVar1);
  }
  local_158._0_8_ = local_158 + 0x30;
  local_158._8_8_ = 1;
  local_158._16_8_ = (_Hash_node_base *)0x0;
  local_158._24_8_ = 0;
  local_158._32_4_ = 1.0;
  local_158._40_8_ = 0;
  local_158._48_8_ = (__node_base_ptr)0x0;
  p_Var3 = &(this->tasks)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,TaskSpec>,std::allocator<std::pair<unsigned_long_const,TaskSpec>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long_const&,TaskSpec&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,TaskSpec>,std::allocator<std::pair<unsigned_long_const,TaskSpec>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_158,p_Var3 + 1,
               *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor);
  }
  std::experimental::filesystem::v1::__cxx11::path::path(&local_a8,&this->db_name);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_e8,&this->db_base);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_168,&(this->config_).config_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::_Rb_tree(&local_118,&(this->iterators)._M_t);
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
            (&local_180,&local_198);
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count = local_158._8_8_;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = local_158._24_8_;
  local_68._M_rehash_policy._4_4_ = local_158._36_4_;
  local_68._M_rehash_policy._M_max_load_factor = (float)local_158._32_4_;
  local_68._M_rehash_policy._M_next_resize = local_158._40_8_;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_120._M_h = (__hashtable_alloc *)&local_68;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,TaskSpec>,std::allocator<std::pair<unsigned_long_const,TaskSpec>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,TaskSpec>,std::allocator<std::pair<unsigned_long_const,TaskSpec>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,TaskSpec>,false>>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,TaskSpec>,std::allocator<std::pair<unsigned_long_const,TaskSpec>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_68,
             (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)local_158,&local_120);
  DatabaseSnapshot::DatabaseSnapshot
            (__return_storage_ptr__,&local_a8,&local_e8,(DatabaseConfig *)local_168,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
              *)&local_118,&local_180,
             (unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
              *)&local_68);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_180.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.
                    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.
                          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.
                          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::~_Rb_tree(&local_118);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_168 + 8),local_168[0]);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_e8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_a8);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_158);
  if (local_198.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

DatabaseSnapshot Database::snapshot() {
    std::vector<const OnDiskDataset *> cds;
    for (const auto *d : working_datasets) {
        cds.push_back(d);
    }

    std::unordered_map<uint64_t, TaskSpec> taskspecs;
    for (const auto &[k, v] : tasks) {
        taskspecs.emplace(k, *v.get());
    }

    return DatabaseSnapshot(db_name, db_base, config_, iterators, cds,
                            taskspecs);
}